

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                 *this,TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                       *cp)

{
  long in_RSI;
  TPZVec<int> *in_RDI;
  TPZAbstractFrontMatrix<std::complex<double>_> *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  TPZVec<int> *copy;
  TPZStackEqnStorage<std::complex<double>_> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<std::complex<double>,TPZStackEqnStorage<std::complex<double>>,TPZFrontSym<std::complex<double>>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZAbstractFrontMatrix<std::complex<double>_>::TPZAbstractFrontMatrix
            ((TPZAbstractFrontMatrix<std::complex<double>_> *)in_RDI,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZFrontMatrix_02544dd8;
  TPZStackEqnStorage<std::complex<double>_>::TPZStackEqnStorage
            (in_stack_ffffffffffffffd0,(TPZStackEqnStorage<std::complex<double>_> *)(in_RDI + 1));
  copy = (TPZVec<int> *)&in_RDI[0x1993].fStore;
  TPZFrontSym<std::complex<double>_>::TPZFrontSym
            ((TPZFrontSym<std::complex<double>_> *)in_RDI,(TPZFrontSym<std::complex<double>_> *)copy
            );
  in_RDI[0x199c].fNElements = *(int64_t *)(in_RSI + 0x33390);
  in_RDI[0x199c].fNAlloc = *(int64_t *)(in_RSI + 0x33398);
  TPZVec<int>::TPZVec(in_RDI,copy);
  TPZVec<int>::TPZVec(in_RDI,copy);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }